

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

void __thiscall
cppcms::url_mapper::real_assign(url_mapper *this,string *key,string *url,application *child)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  data *pdVar2;
  url_mapper *puVar3;
  string *key_00;
  char *pcVar4;
  iterator iVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  iterator iVar6;
  cppcms_error *pcVar7;
  uint uVar8;
  size_type sVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  allocator local_f9;
  string hkey;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  application *local_a0;
  url_mapper *local_98;
  string *local_90;
  entry e;
  
  e.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  e.child = (application *)0x0;
  e.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  e.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  e.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  e.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  e.parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  e.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  e.parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  e.parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = (url->_M_dataplus)._M_p;
  sVar9 = url->_M_string_length;
  paVar1 = &hkey.field_2;
  uVar11 = 0;
  pcVar13 = pcVar4;
  pcVar10 = pcVar4;
  local_a0 = child;
  local_98 = this;
  local_90 = key;
LAB_0020ef6f:
  if (pcVar13 == pcVar4 + sVar9) {
    if ((local_a0 != (application *)0x0) && (uVar11 != 1)) {
      pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30,pcVar10);
      std::__cxx11::string::string
                ((string *)&hkey,
                 "cppcms::url_mapper the application mapping should use only 1 parameter",
                 (allocator *)&local_c0);
      cppcms_error::cppcms_error(pcVar7,&hkey);
      __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    hkey._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&hkey,pcVar10,pcVar13);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&e,&hkey);
    key_00 = local_90;
    puVar3 = local_98;
    std::__cxx11::string::~string((string *)&hkey);
    e.child = local_a0;
    pdVar2 = (puVar3->d).ptr_;
    if (local_a0 == (application *)0x0) {
      string_key::string_key((string_key *)&hkey,key_00);
      iVar5 = std::
              _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              ::find(&(pdVar2->by_key)._M_t,(key_type *)&hkey);
      std::__cxx11::string::~string((string *)hkey.field_2._M_local_buf);
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(((puVar3->d).ptr_)->by_key)._M_t._M_impl.super__Rb_tree_header) {
        hkey._M_dataplus._M_p = (pointer)0x1;
        iVar6 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>,_std::_Select1st<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>,_std::_Select1st<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                        *)&iVar5._M_node[2]._M_left,(key_type *)&hkey);
        if ((iVar6._M_node != (_Base_ptr)&iVar5._M_node[2]._M_right) &&
           (iVar6._M_node[3]._M_left != (_Base_ptr)0x0)) {
          pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+(&local_c0,"cppcms::url_mapper: ordinary url key `",key_00);
          std::operator+(&hkey,&local_c0,"can\'t be shared with mounted application key");
          cppcms_error::cppcms_error(pcVar7,&hkey);
          __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
    }
    else {
      string_key::string_key((string_key *)&hkey,key_00);
      iVar5 = std::
              _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              ::find(&(pdVar2->by_key)._M_t,(key_type *)&hkey);
      pdVar2 = (puVar3->d).ptr_;
      std::__cxx11::string::~string((string *)hkey.field_2._M_local_buf);
      if ((_Rb_tree_header *)iVar5._M_node != &(pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header)
      {
        pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_c0,"cppcms::url_mapper: mounted application key `",key_00);
        std::operator+(&hkey,&local_c0,"\' can\'t be shared with ordinary url key");
        cppcms_error::cppcms_error(pcVar7,&hkey);
        __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    pdVar2 = (puVar3->d).ptr_;
    string_key::string_key((string_key *)&hkey,key_00);
    this_00 = std::
              map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              ::operator[](&pdVar2->by_key,(key_type *)&hkey);
    local_c0._M_dataplus._M_p = (pointer)(ulong)uVar11;
    this_01 = std::
              map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
              ::operator[](this_00,(key_type *)&local_c0);
    data::entry::operator=(this_01,&e);
    std::__cxx11::string::~string((string *)hkey.field_2._M_local_buf);
    data::entry::~entry(&e);
    return;
  }
  pcVar12 = pcVar13;
  if (*pcVar13 == '{') {
    hkey._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&hkey,pcVar10,pcVar13);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&e,&hkey);
    std::__cxx11::string::~string((string *)&hkey);
    pcVar4 = (url->_M_dataplus)._M_p;
    sVar9 = url->_M_string_length;
    for (; pcVar12 != pcVar4 + sVar9; pcVar12 = pcVar12 + 1) {
      if (*pcVar12 == '}') {
        hkey._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&hkey,pcVar13 + 1,pcVar12);
        if (hkey._M_string_length == 0) {
          pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_c0,"cppcms::url_mapper: empty index between {}",
                     (allocator *)&index);
          cppcms_error::cppcms_error(pcVar7,&local_c0);
          __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        pcVar13 = pcVar12 + 1;
        bVar14 = true;
        uVar8 = 0;
        goto LAB_0020f013;
      }
    }
    goto LAB_0020f0b7;
  }
  if (*pcVar13 == '}') {
    pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30,pcVar10);
    std::__cxx11::string::string
              ((string *)&hkey,"cppcms::url_mapper: \'}\' in url without \'{\'",
               (allocator *)&local_c0);
    cppcms_error::cppcms_error(pcVar7,&hkey);
    __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  goto LAB_0020f0c7;
LAB_0020f013:
  if (!bVar14) goto LAB_0020f02f;
  if (hkey._M_string_length <= uVar8) {
    index = atoi(hkey._M_dataplus._M_p);
    if (index == 0) {
      pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_c0,"cppcms::url_mapper: index 0 is invalid",&local_f9);
      cppcms_error::cppcms_error(pcVar7,&local_c0);
      __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    if ((int)uVar11 < index) {
      uVar11 = index;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&e.indexes,&index);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&e.keys,((long)e.keys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)e.keys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    goto LAB_0020f0a6;
  }
  bVar14 = (byte)(hkey._M_dataplus._M_p[uVar8] - 0x30U) < 10;
  uVar8 = uVar8 + 1;
  goto LAB_0020f013;
LAB_0020f02f:
  local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&e.indexes,(int *)&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&e.keys,&hkey);
LAB_0020f0a6:
  std::__cxx11::string::~string((string *)&hkey);
  pcVar4 = (url->_M_dataplus)._M_p;
  sVar9 = url->_M_string_length;
LAB_0020f0b7:
  pcVar10 = pcVar13;
  if (pcVar12 == pcVar4 + sVar9) {
    pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30,pcVar13);
    std::__cxx11::string::string
              ((string *)&hkey,"cppcms::url_mapper: \'{\' in url without \'}\'",
               (allocator *)&local_c0);
    cppcms_error::cppcms_error(pcVar7,&hkey);
    __cxa_throw(pcVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
LAB_0020f0c7:
  pcVar13 = pcVar12 + 1;
  goto LAB_0020ef6f;
}

Assistant:

void url_mapper::real_assign(std::string const &key,std::string const &url,application *child)
	{

		data::entry e;
		std::string::const_iterator prev = url.begin(), p = url.begin();

		int max_index = 0;

		while(p!=url.end()) {
			if(*p=='{') {
				e.parts.push_back(std::string(prev,p));
				prev = p;
				while(p!=url.end()) {
					if(*p=='}') {
						std::string const hkey(prev+1,p);
						prev = p+1;
						if(hkey.size()==0) {
							throw cppcms_error("cppcms::url_mapper: empty index between {}");
						}
						bool all_digits = true;
						for(unsigned i=0;all_digits && i<hkey.size();i++) {
							if(hkey[i] < '0' || '9' <hkey[i])
								all_digits = false;
						}
						if(!all_digits) {
							e.indexes.push_back(0);
							e.keys.push_back(hkey);
						}
						else {
							int index = atoi(hkey.c_str());
							if(index == 0)
								throw cppcms_error("cppcms::url_mapper: index 0 is invalid");
							max_index = std::max(index,max_index);
							e.indexes.push_back(index);
							e.keys.resize(e.keys.size()+1);
						}
						break;
					}
					else
						p++;
				}
				if(p==url.end())
					throw cppcms_error("cppcms::url_mapper: '{' in url without '}'");
				p++;
			}
			else if(*p=='}') {
				throw cppcms_error("cppcms::url_mapper: '}' in url without '{'");
			}
			else
				p++;
		}
		if(child && max_index!=1) {
			throw cppcms_error("cppcms::url_mapper the application mapping should use only 1 parameter");
		}
		e.parts.push_back(std::string(prev,p));

		e.child = child;

		if(child) {
			if(d->by_key.find(key)!=d->by_key.end()) 
				throw cppcms_error(	"cppcms::url_mapper: mounted application key `" + key +
							"' can't be shared with ordinary url key");
		}
		else {
			data::by_key_type::iterator p = d->by_key.find(key);
			if(p!=d->by_key.end()) {
				data::by_size_type::const_iterator p2 = p->second.find(1);
				if(p2!=p->second.end() && p2->second.child) 
				{
					throw cppcms_error(	"cppcms::url_mapper: ordinary url key `"+key+
								"can't be shared with mounted application key");
				}
			}
		}
		d->by_key[key][max_index] = e;
	}